

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi_p.h
# Opt level: O1

BufferOp *
QRhiResourceUpdateBatchPrivate::BufferOp::dynamicUpdate
          (BufferOp *__return_storage_ptr__,QRhiBuffer *buf,quint32 offset,QByteArray data)

{
  long lVar1;
  qsizetype qVar2;
  QByteArray data_00;
  undefined1 auVar3 [16];
  undefined1 (*in_RCX) [16];
  long in_FS_OFFSET;
  QArrayData *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->buf = (QRhiBuffer *)0x0;
  *(undefined8 *)&__return_storage_ptr__->offset = 0;
  (__return_storage_ptr__->data).d = (QRhiBufferDataPrivate *)0x0;
  *(undefined8 *)&__return_storage_ptr__->readSize = 0;
  __return_storage_ptr__->result = (QRhiReadbackResult *)0x0;
  pQVar4 = *(QArrayData **)*in_RCX;
  auVar3 = *in_RCX;
  *(undefined8 *)*in_RCX = 0;
  *(undefined8 *)(*in_RCX + 8) = 0;
  qVar2 = *(qsizetype *)in_RCX[1];
  *(undefined8 *)in_RCX[1] = 0;
  data_00.d.size = qVar2;
  data_00.d._0_16_ = auVar3;
  changeToDynamicUpdate(__return_storage_ptr__,buf,offset,data_00);
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static BufferOp dynamicUpdate(QRhiBuffer *buf, quint32 offset, QByteArray data)
        {
            BufferOp op = {};
            changeToDynamicUpdate(&op, buf, offset, std::move(data));
            return op;
        }